

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.cpp
# Opt level: O0

void __thiscall QLineEditPrivate::textEdited(QLineEditPrivate *this,QString *text)

{
  CompletionMode CVar1;
  QCompleter *pQVar2;
  QLineEditPrivate *in_RDI;
  int in_stack_0000000c;
  QLineEdit *q;
  QString *in_stack_ffffffffffffffd8;
  
  q_func(in_RDI);
  in_RDI->field_0x27c = in_RDI->field_0x27c & 0xdf | 0x20;
  QLineEdit::textEdited((QLineEdit *)in_RDI,in_stack_ffffffffffffffd8);
  pQVar2 = QWidgetLineControl::completer((QWidgetLineControl *)0x5d15e0);
  if (pQVar2 != (QCompleter *)0x0) {
    QWidgetLineControl::completer((QWidgetLineControl *)0x5d15f7);
    CVar1 = QCompleter::completionMode((QCompleter *)in_RDI);
    if (CVar1 != InlineCompletion) {
      QWidgetLineControl::complete((QWidgetLineControl *)q,in_stack_0000000c);
    }
  }
  return;
}

Assistant:

void QLineEditPrivate::textEdited(const QString &text)
{
    Q_Q(QLineEdit);
    edited = true;
    emit q->textEdited(text);
#if QT_CONFIG(completer)
    if (control->completer()
        && control->completer()->completionMode() != QCompleter::InlineCompletion)
        control->complete(-1); // update the popup on cut/paste/del
#endif
}